

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_tar.c
# Opt level: O0

wchar_t archive_read_format_tar_skip(archive_read *a)

{
  int64_t iVar1;
  long in_RDI;
  tar *tar;
  int64_t bytes_skipped;
  int64_t in_stack_ffffffffffffffd8;
  archive_read *a_00;
  wchar_t local_4;
  
  a_00 = (archive_read *)**(undefined8 **)(in_RDI + 0x948);
  iVar1 = __archive_read_consume(a_00,in_stack_ffffffffffffffd8);
  if (iVar1 < 0) {
    local_4 = L'\xffffffe2';
  }
  else {
    a_00->bidders[0].name = (char *)0x0;
    a_00->bidders[0].options = (_func_int_archive_read_filter_bidder_ptr_char_ptr_char_ptr *)0x0;
    a_00->bidders[0].init = (_func_int_archive_read_filter_ptr *)0x0;
    gnu_clear_sparse_list((tar *)a_00);
    local_4 = L'\0';
  }
  return local_4;
}

Assistant:

static int
archive_read_format_tar_skip(struct archive_read *a)
{
	int64_t bytes_skipped;
	struct tar* tar;

	tar = (struct tar *)(a->format->data);

	bytes_skipped = __archive_read_consume(a,
	    tar->entry_bytes_remaining + tar->entry_padding +
	    tar->entry_bytes_unconsumed);
	if (bytes_skipped < 0)
		return (ARCHIVE_FATAL);

	tar->entry_bytes_remaining = 0;
	tar->entry_bytes_unconsumed = 0;
	tar->entry_padding = 0;

	/* Free the sparse list. */
	gnu_clear_sparse_list(tar);

	return (ARCHIVE_OK);
}